

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O1

Node * __thiscall Parser::parseTableCreation(Parser *this)

{
  pointer *ppEVar1;
  int iVar2;
  iterator __position;
  Token *t;
  pointer pTVar3;
  Node *expression;
  TokenType token_type;
  int iVar4;
  Node *unaff_R15;
  Node *value;
  Node *key;
  vector<Node_*,_std::allocator<Node_*>_> keys;
  vector<Token_*,_std::allocator<Token_*>_> assignmentTokens;
  vector<Node_*,_std::allocator<Node_*>_> values;
  Node *local_98;
  Node *local_90;
  vector<Node_*,_std::allocator<Node_*>_> local_88;
  vector<Token_*,_std::allocator<Token_*>_> local_68;
  vector<Node_*,_std::allocator<Node_*>_> local_48;
  
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_start & 0xffffffff00000000);
  __position._M_current =
       (this->expressionContext).
       super__Vector_base<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->expressionContext).
      super__Vector_base<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>::
    _M_realloc_insert<Parser::ExpressionContext>
              (&this->expressionContext,__position,(ExpressionContext *)&local_88);
  }
  else {
    *__position._M_current = EC_USUAL;
    (this->expressionContext).
    super__Vector_base<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  t = this->tok;
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Node **)0x0;
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Node **)0x0;
  local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Node **)0x0;
  local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Node **)0x0;
  local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Token **)0x0;
  local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Token **)0x0;
  iVar4 = this->pos;
  pTVar3 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar3[iVar4].type == TK_RBRACE) {
    this->tok = pTVar3 + iVar4;
    this->pos = iVar4 + 1;
    unaff_R15 = createTableCreationNode(this,t,&local_88,&local_48,&local_68);
  }
  else {
    do {
      local_90 = (Node *)0x0;
      local_98 = (Node *)0x0;
      iVar4 = this->pos;
      pTVar3 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pTVar3[iVar4].type == TK_IDENTIFIER) {
        this->tok = pTVar3 + iVar4;
        this->pos = iVar4 + 1;
        local_90 = createIdentifierNode(this,pTVar3 + iVar4);
        iVar4 = this->pos;
        pTVar3 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pTVar3[iVar4].type == TK_ASSIGN) {
          this->tok = pTVar3 + iVar4;
          this->pos = iVar4 + 1;
        }
        else {
          local_98 = createIdentifierNode(this,this->tok);
        }
      }
      else {
        iVar4 = this->pos;
        if (pTVar3[iVar4].type == TK_LSQUARE) {
          this->tok = pTVar3 + iVar4;
          this->pos = iVar4 + 1;
          expression = parseTernaryOp(this);
          local_90 = createMakeKeyNode(this,pTVar3 + iVar4,expression);
          token_type = TK_ASSIGN;
          expect(this,TK_RSQUARE);
        }
        else {
          iVar4 = this->pos;
          if (pTVar3[iVar4].type != TK_STRING_LITERAL) {
            iVar4 = this->pos;
            if (pTVar3[iVar4].type == TK_FUNCTION) {
              this->tok = pTVar3 + iVar4;
              this->pos = iVar4 + 1;
              local_98 = parseFunction(this,FT_FUNCTION);
              if (local_98 != (Node *)0x0) {
                local_90 = *(local_98->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              }
            }
            goto LAB_001134b7;
          }
          this->tok = pTVar3 + iVar4;
          this->pos = iVar4 + 1;
          local_90 = createOperandNode(this,pTVar3 + iVar4);
          token_type = TK_COLON;
        }
        expect(this,token_type);
      }
LAB_001134b7:
      iVar4 = 2;
      if ((local_90 != (Node *)0x0) && (this->ctx->isError == false)) {
        if (local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*const&>
                    ((vector<Token*,std::allocator<Token*>> *)&local_68,
                     (iterator)
                     local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&this->tok);
        }
        else {
          *local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
           super__Vector_impl_data._M_finish = this->tok;
          local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_98 == (Node *)0x0) {
          local_98 = parseTernaryOp(this);
        }
        if (local_98 != (Node *)0x0) {
          if (local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                      ((vector<Node*,std::allocator<Node*>> *)&local_88,
                       (iterator)
                       local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_90);
          }
          else {
            *local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish = local_90;
            local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                      ((vector<Node*,std::allocator<Node*>> *)&local_48,
                       (iterator)
                       local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_98);
          }
          else {
            *local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish = local_98;
            local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          iVar4 = this->pos;
          pTVar3 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (pTVar3[iVar4].type == TK_COMMA) {
            this->tok = pTVar3 + iVar4;
            this->pos = iVar4 + 1;
          }
          iVar2 = this->pos;
          iVar4 = 0;
          if (pTVar3[iVar2].type == TK_RBRACE) {
            this->tok = pTVar3 + iVar2;
            this->pos = iVar2 + 1;
            unaff_R15 = createTableCreationNode(this,t,&local_88,&local_48,&local_68);
            iVar4 = 1;
          }
        }
      }
    } while (iVar4 == 0);
    if (iVar4 == 2) {
      unaff_R15 = (Node *)0x0;
    }
  }
  if (local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ppEVar1 = &(this->expressionContext).
             super__Vector_base<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppEVar1 = *ppEVar1 + -1;
  return unaff_R15;
}

Assistant:

Node * parseTableCreation()
  {
    EXPRESSION_CONTEXT_SCOPE(EC_USUAL);

    Token & opToken = *tok;
    std::vector<Node *> keys;
    std::vector<Node *> values;
    std::vector<Token *> assignmentTokens;

    if (accept(TK_RBRACE))
      return createTableCreationNode(opToken, keys, values, assignmentTokens);

    for (;;)
    {
      Node * key = nullptr;
      Node * value = nullptr;

      if (accept(TK_IDENTIFIER))
      {
        key = createIdentifierNode(*tok);
        if (!accept(TK_ASSIGN))
          value = createIdentifierNode(*tok);
      }
      else if (accept(TK_LSQUARE))
      {
        key = createMakeKeyNode(*tok, parseTernaryOp());
        expect(TK_RSQUARE);
        expect(TK_ASSIGN);
      }
      else if (accept(TK_STRING_LITERAL))
      {
        key = createOperandNode(*tok);
        expect(TK_COLON);
      }
      else if (accept(TK_FUNCTION))
      {
        value = parseFunction(FT_FUNCTION);
        if (value)
          key = value->children[0]; // function name
      }

      if (!key || ctx.isError)
        break;

      assignmentTokens.push_back(tok);

      if (!value)
        value = parseTernaryOp();
      if (!value)
        break;

      keys.push_back(key);
      values.push_back(value);
      accept(TK_COMMA); // optional comma
      if (accept(TK_RBRACE))
        return createTableCreationNode(opToken, keys, values, assignmentTokens);
    }

    return nullptr;
  }